

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::create_buckets(table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                 *this,size_t new_count)

{
  bucket_pointer ppVar1;
  ptr_bucket *__s;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  
  auVar5 = in_ZMM1._0_16_;
  __s = __gnu_cxx::new_allocator<boost::unordered::detail::ptr_bucket>::allocate
                  ((new_allocator<boost::unordered::detail::ptr_bucket> *)&this->field_0x3,
                   new_count + 1,(void *)0x0);
  if (new_count != 0xffffffffffffffff) {
    memset(__s,0,new_count * 8 + 8);
  }
  ppVar1 = this->buckets_;
  if (ppVar1 != (bucket_pointer)0x0) {
    sVar2 = this->bucket_count_;
    __s[new_count].next_ = ppVar1[sVar2].next_;
    operator_delete(ppVar1,sVar2 * 8 + 8);
  }
  this->bucket_count_ = new_count;
  this->buckets_ = __s;
  if (__s == (ptr_bucket *)0x0) {
    sVar2 = 0;
  }
  else {
    auVar5 = vcvtusi2sd_avx512f(auVar5,new_count);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar5._0_8_ * (double)this->mlf_;
    auVar5 = vroundsd_avx(auVar4,auVar4,10);
    sVar3 = vcvttsd2usi_avx512f(auVar5);
    sVar2 = 0xffffffffffffffff;
    if (auVar5._0_8_ < 1.8446744073709552e+19) {
      sVar2 = sVar3;
    }
  }
  this->max_load_ = sVar2;
  return;
}

Assistant:

void create_buckets(std::size_t new_count)
        {
            boost::unordered::detail::array_constructor<bucket_allocator>
                constructor(bucket_alloc());
    
            // Creates an extra bucket to act as the start node.
            constructor.construct(bucket(), new_count + 1);

            if (buckets_)
            {
                // Copy the nodes to the new buckets, including the dummy
                // node if there is one.
                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        (buckets_ + static_cast<std::ptrdiff_t>(
                            bucket_count_))->next_;
                destroy_buckets();
            }
            else if (bucket::extra_node)
            {
                node_constructor a(node_alloc());
                a.construct();

                (constructor.get() +
                    static_cast<std::ptrdiff_t>(new_count))->next_ =
                        a.release();
            }

            bucket_count_ = new_count;
            buckets_ = constructor.release();
            recalculate_max_load();
        }